

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuList.c
# Opt level: O0

void Fxu_ListCubeAddLiteral(Fxu_Cube *pCube,Fxu_Lit *pLink)

{
  Fxu_ListLit *pList;
  Fxu_Lit *pLink_local;
  Fxu_Cube *pCube_local;
  
  if ((pCube->lLits).pHead == (Fxu_Lit *)0x0) {
    (pCube->lLits).pHead = pLink;
    (pCube->lLits).pTail = pLink;
    pLink->pHPrev = (Fxu_Lit *)0x0;
    pLink->pHNext = (Fxu_Lit *)0x0;
  }
  else {
    pLink->pHNext = (Fxu_Lit *)0x0;
    ((pCube->lLits).pTail)->pHNext = pLink;
    pLink->pHPrev = (pCube->lLits).pTail;
    (pCube->lLits).pTail = pLink;
  }
  (pCube->lLits).nItems = (pCube->lLits).nItems + 1;
  return;
}

Assistant:

void Fxu_ListCubeAddLiteral( Fxu_Cube * pCube, Fxu_Lit * pLink )
{
    Fxu_ListLit * pList = &(pCube->lLits);
    if ( pList->pHead == NULL )
    {
        pList->pHead = pLink;
        pList->pTail = pLink;
        pLink->pHPrev = NULL;
        pLink->pHNext = NULL;
    }
    else
    {
        pLink->pHNext = NULL;
        pList->pTail->pHNext = pLink;
        pLink->pHPrev = pList->pTail;
        pList->pTail = pLink;
    }
    pList->nItems++;
}